

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glApi.cpp
# Opt level: O3

void __thiscall Sampler::Sampler(Sampler *this,int texUnit)

{
  long *plVar1;
  
  (this->super_OGLStateObject)._vptr_OGLStateObject = (_func_int **)&PTR_bind_001aa4c8;
  this->m_location = 0;
  this->m_texUnit = texUnit;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failure in file ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/glApi.cpp"
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0xd3);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Sampler::Sampler(int)",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             ": You must complete the implementation (look at the documentation in the header)",0x50
            );
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(1);
}

Assistant:

Sampler::Sampler(int texUnit) : m_location(0), m_texUnit(texUnit)
{
  FAIL_BECAUSE_INCOMPLETE;
}